

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmForEachCommand.cxx
# Opt level: O2

bool __thiscall
cmForEachFunctionBlocker::IsFunctionBlocked
          (cmForEachFunctionBlocker *this,cmListFileFunction *lff,cmMakefile *mf,
          cmExecutionStatus *inStatus)

{
  string *name;
  pointer pcVar1;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  uint uVar5;
  pointer pbVar6;
  string oldDef;
  cmExecutionStatus local_5c;
  long *local_58;
  long *local_50;
  _Rb_tree_color local_48;
  undefined4 uStack_44;
  char local_40;
  
  iVar3 = cmsys::SystemTools::Strucmp((lff->super_cmCommandContext).Name._M_dataplus._M_p,"foreach")
  ;
  if (iVar3 == 0) {
    this->Depth = this->Depth + 1;
  }
  else {
    iVar3 = cmsys::SystemTools::Strucmp
                      ((lff->super_cmCommandContext).Name._M_dataplus._M_p,"endforeach");
    if (iVar3 == 0) {
      if (this->Depth == 0) {
        cmMakefile::RemoveFunctionBlocker
                  ((cmMakefile *)&stack0xffffffffffffffb0,(cmFunctionBlocker *)mf,
                   (cmListFileFunction *)this);
        if (local_50 == (long *)0x0) {
          return false;
        }
        local_58 = local_50;
        local_50 = (long *)&stack0xffffffffffffffc0;
        local_48 = _S_red;
        uStack_44 = 0;
        local_40 = '\0';
        pcVar4 = cmMakefile::GetDefinition
                           (mf,(this->Args).
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start);
        if (pcVar4 != (char *)0x0) {
          cmMakefile::GetDefinition
                    (mf,(this->Args).
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start);
          std::__cxx11::string::assign((char *)&stack0xffffffffffffffb0);
        }
        pbVar6 = (this->Args).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        do {
          pbVar6 = pbVar6 + 1;
          name = (this->Args).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
          if (pbVar6 == (this->Args).
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish) {
            cmMakefile::AddDefinition(mf,name,(char *)local_50);
LAB_002c197e:
            std::__cxx11::string::~string((string *)&stack0xffffffffffffffb0);
            (**(code **)(*local_58 + 0x18))();
            return true;
          }
          cmMakefile::AddDefinition(mf,name,(pbVar6->_M_dataplus)._M_p);
          uVar5 = 0;
          while( true ) {
            pcVar1 = (this->Functions).
                     super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>.
                     _M_impl.super__Vector_impl_data._M_start;
            if ((ulong)((long)(this->Functions).
                              super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pcVar1 >> 6) <=
                (ulong)uVar5) break;
            local_5c.ReturnInvoked = false;
            local_5c.BreakInvoked = false;
            local_5c.ContinueInvoked = false;
            local_5c.NestedError = false;
            cmMakefile::ExecuteCommand(mf,pcVar1 + uVar5,&local_5c);
            if (local_5c.ReturnInvoked == true) {
              inStatus->ReturnInvoked = true;
LAB_002c196d:
              cmMakefile::AddDefinition
                        (mf,(this->Args).
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start,(char *)local_50);
              goto LAB_002c197e;
            }
            if (local_5c.BreakInvoked != false) goto LAB_002c196d;
            if (local_5c.ContinueInvoked != false) break;
            bVar2 = cmSystemTools::GetFatalErrorOccured();
            uVar5 = uVar5 + 1;
            if (bVar2) goto LAB_002c197e;
          }
        } while( true );
      }
      this->Depth = this->Depth + -1;
    }
  }
  std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>::push_back
            (&this->Functions,lff);
  return true;
}

Assistant:

bool cmForEachFunctionBlocker::
IsFunctionBlocked(const cmListFileFunction& lff, cmMakefile &mf,
                  cmExecutionStatus &inStatus)
{
  if (!cmSystemTools::Strucmp(lff.Name.c_str(),"foreach"))
    {
    // record the number of nested foreach commands
    this->Depth++;
    }
  else if (!cmSystemTools::Strucmp(lff.Name.c_str(),"endforeach"))
    {
    // if this is the endofreach for this statement
    if (!this->Depth)
      {
      // Remove the function blocker for this scope or bail.
      cmsys::auto_ptr<cmFunctionBlocker>
        fb(mf.RemoveFunctionBlocker(this, lff));
      if(!fb.get()) { return false; }

      // at end of for each execute recorded commands
      // store the old value
      std::string oldDef;
      if (mf.GetDefinition(this->Args[0]))
        {
        oldDef = mf.GetDefinition(this->Args[0]);
        }
      std::vector<std::string>::const_iterator j = this->Args.begin();
      ++j;

      for( ; j != this->Args.end(); ++j)
        {
        // set the variable to the loop value
        mf.AddDefinition(this->Args[0],j->c_str());
        // Invoke all the functions that were collected in the block.
        cmExecutionStatus status;
        for(unsigned int c = 0; c < this->Functions.size(); ++c)
          {
          status.Clear();
          mf.ExecuteCommand(this->Functions[c],status);
          if (status.GetReturnInvoked())
            {
            inStatus.SetReturnInvoked(true);
            // restore the variable to its prior value
            mf.AddDefinition(this->Args[0],oldDef.c_str());
            return true;
            }
          if (status.GetBreakInvoked())
            {
            // restore the variable to its prior value
            mf.AddDefinition(this->Args[0],oldDef.c_str());
            return true;
            }
          if (status.GetContinueInvoked())
            {
            break;
            }
          if(cmSystemTools::GetFatalErrorOccured() )
            {
            return true;
            }
          }
        }

      // restore the variable to its prior value
      mf.AddDefinition(this->Args[0],oldDef.c_str());
      return true;
      }
    else
      {
      // close out a nested foreach
      this->Depth--;
      }
    }

  // record the command
  this->Functions.push_back(lff);

  // always return true
  return true;
}